

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::OneofDescriptorProto::OneofDescriptorProto
          (OneofDescriptorProto *this,OneofDescriptorProto *from)

{
  void *pvVar1;
  uint uVar2;
  OneofOptions *this_00;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__OneofDescriptorProto_0042abc0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->name_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  uVar2 = (from->_has_bits_).has_bits_[0];
  if ((uVar2 & 1) != 0) {
    internal::ArenaStringPtr::AssignWithDefault
              (&this->name_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
               (from->name_).ptr_);
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  if ((uVar2 & 2) == 0) {
    this_00 = (OneofOptions *)0x0;
  }
  else {
    this_00 = (OneofOptions *)operator_new(0x68);
    OneofOptions::OneofOptions(this_00,from->options_);
  }
  this->options_ = this_00;
  return;
}

Assistant:

OneofDescriptorProto::OneofDescriptorProto(const OneofDescriptorProto& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  name_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_name()) {
    name_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.name_);
  }
  if (from.has_options()) {
    options_ = new ::google::protobuf::OneofOptions(*from.options_);
  } else {
    options_ = NULL;
  }
  // @@protoc_insertion_point(copy_constructor:google.protobuf.OneofDescriptorProto)
}